

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsInfo.cpp
# Opt level: O2

void reportInfo(FILE *file,InfoRecordDouble *info,HighsFileType file_type)

{
  string sStack_98;
  string local_78;
  string local_58;
  string local_38;
  
  if (file_type == kFull) {
    fprintf((FILE *)file,"\n# %s\n# [type: double]\n%s = %g\n",*info->value,
            (info->super_InfoRecord).description._M_dataplus._M_p,
            (info->super_InfoRecord).name._M_dataplus._M_p);
    return;
  }
  if (file_type == kMd) {
    std::__cxx11::string::string((string *)&local_58,(string *)&(info->super_InfoRecord).name);
    highsInsertMdEscapes(&local_78,&local_58);
    std::__cxx11::string::string
              ((string *)&sStack_98,(string *)&(info->super_InfoRecord).description);
    highsInsertMdEscapes(&local_38,&sStack_98);
    fprintf((FILE *)file,"## %s\n- %s\n- Type: double\n\n",local_78._M_dataplus._M_p,
            local_38._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&sStack_98);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_58);
    return;
  }
  fprintf((FILE *)file,"%-30s = %g\n",*info->value,(info->super_InfoRecord).name._M_dataplus._M_p);
  return;
}

Assistant:

void reportInfo(FILE* file, const InfoRecordDouble& info,
                const HighsFileType file_type) {
  if (file_type == HighsFileType::kMd) {
    fprintf(file, "## %s\n- %s\n- Type: double\n\n",
            highsInsertMdEscapes(info.name).c_str(),
            highsInsertMdEscapes(info.description).c_str());
  } else if (file_type == HighsFileType::kFull) {
    fprintf(file, "\n# %s\n# [type: double]\n%s = %g\n",
            info.description.c_str(), info.name.c_str(), *info.value);
  } else {
    fprintf(file, "%-30s = %g\n", info.name.c_str(), *info.value);
  }
}